

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleighbase.cc
# Opt level: O1

VarnodeData * __thiscall SleighBase::getRegister(SleighBase *this,string *nm)

{
  int iVar1;
  SleighSymbol *pSVar2;
  LowlevelError *pLVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  pSVar2 = SymbolTable::findSymbolInternal(&this->symtab,(this->symtab).curscope,nm);
  if (pSVar2 == (SleighSymbol *)0x0) {
    pLVar3 = (LowlevelError *)__cxa_allocate_exception(0x20);
    std::operator+(&bStack_38,"Unknown register name: ",nm);
    LowlevelError::LowlevelError(pLVar3,&bStack_38);
    __cxa_throw(pLVar3,&SleighError::typeinfo,LowlevelError::~LowlevelError);
  }
  iVar1 = (*pSVar2->_vptr_SleighSymbol[2])(pSVar2);
  if (iVar1 == 6) {
    return (VarnodeData *)&pSVar2[1].name;
  }
  pLVar3 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::operator+(&bStack_38,"Symbol is not a register: ",nm);
  LowlevelError::LowlevelError(pLVar3,&bStack_38);
  __cxa_throw(pLVar3,&SleighError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

const VarnodeData &SleighBase::getRegister(const string &nm) const

{
  VarnodeSymbol *sym = (VarnodeSymbol *)findSymbol(nm);
  if (sym == (VarnodeSymbol *)0)
    throw SleighError("Unknown register name: "+nm);
  if (sym->getType() != SleighSymbol::varnode_symbol)
    throw SleighError("Symbol is not a register: "+nm);
  return sym->getFixedVarnode();
}